

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::add_blocked_sample
          (TypedTimeSamples<std::array<float,_4UL>_> *this,double t)

{
  pointer *ppSVar1;
  iterator __position;
  Sample local_28;
  
  local_28.blocked = true;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_28.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
                *)this,__position,&local_28);
  }
  else {
    *(undefined8 *)(((__position._M_current)->value)._M_elems + 2) = local_28.value._M_elems._8_8_;
    *(ulong *)&(__position._M_current)->blocked = CONCAT71(local_28._25_7_,1);
    (__position._M_current)->t = t;
    *(undefined8 *)((__position._M_current)->value)._M_elems = local_28.value._M_elems._0_8_;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }